

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonWriter.cpp
# Opt level: O0

void __thiscall adios2::core::engine::SkeletonWriter::InitParameters(SkeletonWriter *this)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first_00;
  bool bVar1;
  long in_RDI;
  string value;
  string key;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  iterator __end2;
  iterator __begin2;
  Params *__range2;
  allocator *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  string *in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec0;
  undefined1 local_129 [40];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [32];
  char *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  string local_98 [32];
  char *local_78;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  string local_48 [32];
  reference local_28;
  _Self local_20;
  _Self local_18;
  long local_10;
  
  local_10 = *(long *)(in_RDI + 0x28) + 0x60;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffe58);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffe58);
  while (bVar1 = std::operator!=(&local_18,&local_20), bVar1) {
    local_28 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)0xaa6681);
    std::__cxx11::string::string(local_48,(string *)local_28);
    local_50 = std::__cxx11::string::begin();
    local_58 = std::__cxx11::string::end();
    local_60 = std::__cxx11::string::begin();
    __first._M_current._4_4_ = in_stack_fffffffffffffe7c;
    __first._M_current._0_4_ = in_stack_fffffffffffffe78;
    local_78 = (char *)std::
                       transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                                 (__first,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                                  (_func_int_int *)in_stack_fffffffffffffe60);
    std::__cxx11::string::string(local_98,(string *)&local_28->second);
    local_a0 = std::__cxx11::string::begin();
    local_a8 = std::__cxx11::string::end();
    local_b0 = std::__cxx11::string::begin();
    __first_00._M_current._4_4_ = in_stack_fffffffffffffe7c;
    __first_00._M_current._0_4_ = in_stack_fffffffffffffe78;
    local_b8 = (char *)std::
                       transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                                 (__first_00,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                                  (_func_int_int *)in_stack_fffffffffffffe60);
    bVar1 = std::operator==(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
    in_stack_fffffffffffffe7c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe7c);
    if (bVar1) {
      in_stack_fffffffffffffe78 =
           std::__cxx11::stoi(in_stack_fffffffffffffe60,(size_t *)in_stack_fffffffffffffe58,0);
      *(int *)(in_RDI + 0xc0) = in_stack_fffffffffffffe78;
      if ((*(int *)(in_RDI + 0xc0) < 0) || (5 < *(int *)(in_RDI + 0xc0))) {
        in_stack_fffffffffffffe70._M_current = (char *)&local_d9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_d8,"Engine",(allocator *)in_stack_fffffffffffffe70._M_current);
        in_stack_fffffffffffffe68._M_current = (char *)&local_101;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_100,"SkeletonWriter",(allocator *)in_stack_fffffffffffffe68._M_current);
        in_stack_fffffffffffffe60 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_129;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_129 + 1),"InitParameters",(allocator *)in_stack_fffffffffffffe60
                  );
        in_stack_fffffffffffffe58 = (allocator *)&stack0xfffffffffffffeaf;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffeb0,
                   "Method verbose argument must be an integer in the range [0,5], in call to Open or Engine constructor"
                   ,in_stack_fffffffffffffe58);
        helper::Throw<std::invalid_argument>
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                   in_stack_fffffffffffffea8,(int)((ulong)in_RDI >> 0x20));
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeaf);
        std::__cxx11::string::~string((string *)(local_129 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_129);
        std::__cxx11::string::~string(local_100);
        std::allocator<char>::~allocator((allocator<char> *)&local_101);
        std::__cxx11::string::~string(local_d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      }
    }
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_48);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffe60);
  }
  return;
}

Assistant:

void SkeletonWriter::InitParameters()
{
    for (const auto &pair : m_IO.m_Parameters)
    {
        std::string key(pair.first);
        std::transform(key.begin(), key.end(), key.begin(), ::tolower);

        std::string value(pair.second);
        std::transform(value.begin(), value.end(), value.begin(), ::tolower);

        if (key == "verbose")
        {
            m_Verbosity = std::stoi(value);
            if (m_Verbosity < 0 || m_Verbosity > 5)
                helper::Throw<std::invalid_argument>("Engine", "SkeletonWriter", "InitParameters",
                                                     "Method verbose argument must be an "
                                                     "integer in the range [0,5], in call to "
                                                     "Open or Engine constructor");
        }
    }
}